

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O1

void __thiscall fasttext::QuantMatrix::save(QuantMatrix *this,ostream *out)

{
  std::ostream::write((char *)out,(long)&this->qnorm_);
  std::ostream::write((char *)out,(long)&(this->super_Matrix).m_);
  std::ostream::write((char *)out,(long)&(this->super_Matrix).n_);
  std::ostream::write((char *)out,(long)&this->codesize_);
  std::ostream::write((char *)out,
                      (long)(this->codes_).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  ProductQuantizer::save
            ((this->pq_)._M_t.
             super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
             ._M_t.
             super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
             .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,out);
  if (this->qnorm_ == true) {
    std::ostream::write((char *)out,
                        (long)(this->norm_codes_).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    ProductQuantizer::save
              ((this->npq_)._M_t.
               super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
               ._M_t.
               super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
               .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,out);
    return;
  }
  return;
}

Assistant:

void QuantMatrix::save(std::ostream& out) const {
  out.write((char*)&qnorm_, sizeof(qnorm_));
  out.write((char*)&m_, sizeof(m_));
  out.write((char*)&n_, sizeof(n_));
  out.write((char*)&codesize_, sizeof(codesize_));
  out.write((char*)codes_.data(), codesize_ * sizeof(uint8_t));
  pq_->save(out);
  if (qnorm_) {
    out.write((char*)norm_codes_.data(), m_ * sizeof(uint8_t));
    npq_->save(out);
  }
}